

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O3

void __thiscall
Centaurus::ATNNode<unsigned_char>::ATNNode(ATNNode<unsigned_char> *this,ATNNode<unsigned_char> *old)

{
  anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
  *paVar1;
  pointer puVar2;
  pointer pAVar3;
  undefined8 uVar4;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
  *paVar5;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_001a7720;
  pAVar3 = (old->m_transitions).
           super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (old->m_transitions).
       super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pAVar3;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (old->m_transitions).
       super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (old->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (old->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (old->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_type = old->m_type;
  (this->m_invoke)._vptr_Identifier = (_func_int **)&PTR__Identifier_001a5d30;
  std::__cxx11::wstring::wstring((wstring *)&(this->m_invoke).m_id,(wstring *)&(old->m_invoke).m_id)
  ;
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001a77a8;
  std::
  vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ::vector(&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>.m_states,
           &(old->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>.m_states);
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001a7750;
  paVar1 = &(this->m_literal).field_2;
  paVar5 = &(old->m_literal).field_2;
  (this->m_literal)._M_dataplus._M_p = (pointer)paVar1;
  puVar2 = (old->m_literal)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)puVar2 == paVar5) {
    uVar4 = *(undefined8 *)((long)&(old->m_literal).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_literal).field_2 + 8) = uVar4;
  }
  else {
    (this->m_literal)._M_dataplus._M_p = puVar2;
    (this->m_literal).field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  (this->m_literal)._M_string_length = (old->m_literal)._M_string_length;
  (old->m_literal)._M_dataplus._M_p = (pointer)paVar5;
  (old->m_literal)._M_string_length = 0;
  (old->m_literal).field_2._M_local_buf[0] = '\0';
  this->m_localid = old->m_localid;
  return;
}

Assistant:

ATNNode(ATNNode<TCHAR>&& old)
        : m_transitions(std::move(old.m_transitions)), m_type(old.m_type), m_invoke(std::move(old.m_invoke)), m_nfa(std::move(old.m_nfa)), m_literal(std::move(old.m_literal)), m_localid(old.m_localid)
    {
    }